

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_query.c
# Opt level: O0

int dwarf_debug_addr_index_to_addr
              (Dwarf_Die die,Dwarf_Unsigned index,Dwarf_Addr *return_addr,Dwarf_Error *error)

{
  Dwarf_Debug pDVar1;
  Dwarf_Debug ckdi_dbg;
  int res;
  Dwarf_CU_Context_conflict context;
  Dwarf_Debug dbg;
  Dwarf_Error *error_local;
  Dwarf_Addr *return_addr_local;
  Dwarf_Unsigned index_local;
  Dwarf_Die die_local;
  
  if (die == (Dwarf_Die)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x34);
    die_local._4_4_ = 1;
  }
  else if (die->di_cu_context == (Dwarf_CU_Context_conflict)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x68);
    die_local._4_4_ = 1;
  }
  else {
    pDVar1 = die->di_cu_context->cc_dbg;
    if ((pDVar1 == (Dwarf_Debug)0x0) || (pDVar1->de_magic != 0xebfdebfd)) {
      _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                          "DW_DLE_DBG_NULL: accesing a cu context, Dwarf_Debug either null or it containsa stale Dwarf_Debug pointer"
                         );
      die_local._4_4_ = 1;
    }
    else {
      die_local._4_4_ =
           _dwarf_look_in_local_and_tied_by_index
                     (die->di_cu_context->cc_dbg,die->di_cu_context,index,return_addr,error);
    }
  }
  return die_local._4_4_;
}

Assistant:

int
dwarf_debug_addr_index_to_addr(Dwarf_Die die,
    Dwarf_Unsigned index,
    Dwarf_Addr  *return_addr,
    Dwarf_Error *error)
{
    Dwarf_Debug dbg = 0;
    Dwarf_CU_Context context = 0;
    int res = 0;

    CHECK_DIE(die, DW_DLV_ERROR);
    context = die->di_cu_context;
    dbg = context->cc_dbg;

    /* error is returned on dbg, not tieddbg. */
    res = _dwarf_look_in_local_and_tied_by_index(dbg,
        context,
        index,
        return_addr,
        error);
    return res;
}